

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regset.c
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *pFVar1;
  ulong uVar2;
  undefined8 uVar3;
  char *pcVar4;
  char **ps;
  char **ps_00;
  int iVar5;
  int iVar6;
  int iVar7;
  int to;
  char *end;
  int in_stack_ffffffffffffffb8;
  OnigEncoding use_encs [1];
  size_t n;
  
  onig_initialize();
  srand(0x3039);
  XX_LEAD = 0;
  ::n(0x19b,0,(char **)0x0," abab bccab ca");
  iVar5 = 3;
  pcVar4 = " abab bccab ca";
  iVar6 = 8;
  to = 0xb;
  iVar7 = iVar5;
  x2(0x19c,3,p1," abab bccab ca",8,0xb);
  x3(0x19d,iVar7,ps,pcVar4,iVar6,to,in_stack_ffffffffffffffb8);
  ::n(0x19e,3,p2," XXXX AAA 1223 012345678bbb");
  x2(0x19f,3,p2,"0123456789",9,10);
  x2(0x1a0,10,p7,"abcde 555 qwert",6,9);
  x2(0x1a1,2,p8,"",0,0);
  XX_LEAD = 1;
  ::n(0x1a5,0,(char **)0x0," abab bccab ca");
  pcVar4 = " abab bccab ca";
  iVar7 = 8;
  iVar6 = 0xb;
  x2(0x1a6,3,p1," abab bccab ca",8,0xb);
  x3(0x1a7,iVar5,ps_00,pcVar4,iVar7,iVar6,in_stack_ffffffffffffffb8);
  ::n(0x1a8,3,p2," XXXX AAA 1223 012345678bbb");
  x2(0x1a9,3,p2,"0123456789",9,10);
  x2(0x1aa,10,p7,"abcde 555 qwert",6,9);
  pFVar1 = fopen("kofu-utf8.txt","r");
  if (pFVar1 != (FILE *)0x0) {
    n = 0;
    pcVar4 = (char *)0x0;
    uVar2 = getdelim((char **)&stack0xffffffffffffffb8,&n,-1,pFVar1);
    fclose(pFVar1);
    if (-1 < (long)uVar2) {
      end = pcVar4 + uVar2;
      fprintf(_stdout,"FILE: %s, size: %d\n","kofu-utf8.txt",uVar2 & 0xffffffff);
      x2(0x1b8,3,p2,pcVar4,10,0x16);
      x2(0x1b9,4,p3,pcVar4,0x791cf,0x791d8);
      x2(0x1ba,0x10,p4,pcVar4,0x50e,0x523);
      pFVar1 = _stdout;
      iVar6 = nerror;
      iVar5 = nfail;
      iVar7 = nsucc;
      uVar3 = onig_version();
      fprintf(pFVar1,"\nRESULT   SUCC: %4d,  FAIL: %d,  ERROR: %d      (by Oniguruma %s)\n",
              (ulong)(uint)iVar7,(ulong)(uint)iVar5,(ulong)(uint)iVar6,uVar3);
      fputc(10,_stdout);
      time_compare(3,p2,pcVar4,end);
      time_compare(4,p3,pcVar4,end);
      time_compare(0x10,p4,pcVar4,end);
      time_compare(0xe,p5,pcVar4,end);
      time_compare(5,p6,pcVar4,end);
      fputc(10,_stdout);
      free(pcVar4);
      goto LAB_0010261e;
    }
  }
  fprintf(_stdout,"Ignore %s\n","kofu-utf8.txt");
  pFVar1 = _stdout;
  iVar6 = nerror;
  iVar5 = nfail;
  iVar7 = nsucc;
  uVar3 = onig_version();
  fprintf(pFVar1,"\nRESULT   SUCC: %4d,  FAIL: %d,  ERROR: %d      (by Oniguruma %s)\n",
          (ulong)(uint)iVar7,(ulong)(uint)iVar5,(ulong)(uint)iVar6,uVar3);
LAB_0010261e:
  onig_end();
  return -(uint)(nerror != 0 || nfail != 0);
}

Assistant:

extern int
main(int argc, char* argv[])
{
#ifndef _WIN32
  int file_exist;
#endif
  int r;
  char *s, *end;
  OnigEncoding use_encs[1];

  use_encs[0] = ONIG_ENCODING_UTF8;
  onig_initialize(use_encs, sizeof(use_encs)/sizeof(use_encs[0]));

  srand(12345);

  XX_LEAD = ONIG_REGSET_POSITION_LEAD;

  NZERO(" abab bccab ca");
  X2(p1, " abab bccab ca", 8, 11);
  X3(p1, " abab bccab ca", 8, 11, 1);
  N(p2, " XXXX AAA 1223 012345678bbb");
  X2(p2, "0123456789", 9, 10);
  X2(p7, "abcde 555 qwert", 6, 9);
  X2(p8, "", 0, 0);

  XX_LEAD = ONIG_REGSET_REGEX_LEAD;

  NZERO(" abab bccab ca");
  X2(p1, " abab bccab ca", 8, 11);
  X3(p1, " abab bccab ca", 8, 11, 1);
  N(p2, " XXXX AAA 1223 012345678bbb");
  X2(p2, "0123456789", 9, 10);
  X2(p7, "abcde 555 qwert", 6, 9);

#ifndef _WIN32
  r = get_all_content_of_file(TEXT_PATH, &s, &end);
  if (r == 0) {
    fprintf(stdout, "FILE: %s, size: %d\n", TEXT_PATH, (int )(end - s));
    file_exist = 1;
  }
  else {
    fprintf(stdout, "Ignore %s\n", TEXT_PATH);
    file_exist = 0;
  }

  if (file_exist != 0) {
    X2(p2, s, 10, 22);
    X2(p3, s, 496079, 496088);
    X2(p4, s, 1294, 1315);
  }
#endif

  fprintf(stdout,
          "\nRESULT   SUCC: %4d,  FAIL: %d,  ERROR: %d      (by Oniguruma %s)\n",
          nsucc, nfail, nerror, onig_version());

#ifndef _WIN32
  if (file_exist != 0) {
    fprintf(stdout, "\n");
    time_compare(ASIZE(p2), p2, s, end);
    time_compare(ASIZE(p3), p3, s, end);
    time_compare(ASIZE(p4), p4, s, end);
    time_compare(ASIZE(p5), p5, s, end);
    time_compare(ASIZE(p6), p6, s, end);
    fprintf(stdout, "\n");
    free(s);
  }
#endif

  onig_end();

  return ((nfail == 0 && nerror == 0) ? 0 : -1);
}